

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

int pbrt::GenerateLightSubpath
              (Integrator *integrator,SampledWavelengths *lambda,SamplerHandle *sampler,
              CameraHandle *camera,ScratchBuffer *scratchBuffer,int maxDepth,Float time,
              LightSamplerHandle lightSampler,Vertex *path,bool regularize)

{
  float fVar1;
  float fVar2;
  Interval IVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  undefined1 auVar9 [32];
  byte bVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  HaltonSampler *pHVar16;
  DebugMLTSampler *pDVar17;
  undefined4 uVar18;
  undefined4 in_register_0000008c;
  undefined8 uVar19;
  uint *puVar20;
  undefined1 auVar21 [16];
  Float FVar22;
  undefined1 auVar23 [16];
  Tuple2<pbrt::Point2,_float> u1;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar24 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar25 [64];
  Tuple2<pbrt::Point2,_float> u2;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar26 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar27 [64];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 in_ZMM1 [64];
  undefined4 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  SampledSpectrum beta;
  undefined1 local_328 [16];
  optional<pbrt::SampledLight> sampledLight;
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 local_2f0;
  float local_2e8;
  Float local_2e4;
  Integrator *local_2e0;
  Float local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  CameraHandle *local_2c0;
  undefined8 local_2b8;
  ScratchBuffer *local_2b0;
  undefined8 local_2a8;
  undefined1 auStack_29c [12];
  Float FStack_290;
  undefined8 local_288;
  uint local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  undefined4 uStack_270;
  float fStack_26c;
  float fStack_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined8 uStack_25c;
  undefined8 uStack_254;
  optional<pbrt::LightLeSample> les;
  LightSamplerHandle local_190;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_188;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_180;
  undefined1 local_178 [40];
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  uintptr_t uStack_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined8 uStack_cc;
  undefined8 uStack_c4;
  undefined8 uStack_bc;
  uint uStack_b4;
  undefined4 local_b0;
  undefined8 uStack_ac;
  undefined4 uStack_a4;
  undefined4 local_a0;
  RayDifferential local_98;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  auVar21 = in_ZMM1._0_16_;
  uVar19 = CONCAT44(in_register_0000008c,maxDepth);
  if (maxDepth == 0) {
    return 0;
  }
  local_150.bits =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_2e4 = time;
  local_2c0 = camera;
  local_2b8 = uVar19;
  local_2b0 = scratchBuffer;
  FVar22 = DispatchSplit<9>::operator()((DispatchSplit<9> *)&les,&local_150,local_150.bits >> 0x30);
  uVar18 = (undefined4)uVar19;
  uVar13 = *(ulong *)lightSampler.
                     super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                     .bits;
  if (((ushort)(uVar13 >> 0x30) < 3) && ((uVar13 & 0x3000000000000) == 0x2000000000000)) {
    PowerLightSampler::Sample(&sampledLight,(PowerLightSampler *)(uVar13 & 0xffffffffffff),FVar22);
    bVar10 = sampledLight.set;
  }
  else {
    lVar4 = *(long *)((uVar13 & 0xffffffffffff) + 0x18);
    if (lVar4 == 0) {
      sampledLight.optionalValue._0_12_ = ZEXT412(0);
      sampledLight.optionalValue._12_4_ = 0;
      sampledLight.set = false;
      sampledLight._17_7_ = 0;
      bVar10 = false;
    }
    else {
      auVar21 = vcvtusi2ss_avx512f(auVar21,lVar4);
      iVar12 = (int)lVar4 + -1;
      iVar14 = (int)(FVar22 * auVar21._0_4_);
      if (iVar14 <= iVar12) {
        iVar12 = iVar14;
      }
      bVar10 = true;
      sampledLight.optionalValue._8_4_ = 1.0 / auVar21._0_4_;
      sampledLight.optionalValue.__align =
           (anon_struct_8_0_00000001_for___align)
           *(undefined8 *)(*(long *)((uVar13 & 0xffffffffffff) + 8) + (long)iVar12 * 8);
    }
    sampledLight.set = (bool)bVar10;
  }
  if ((bVar10 & 1) == 0) {
    return 0;
  }
  local_2f0 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)sampledLight.optionalValue.__align;
  local_2e8 = (float)sampledLight.optionalValue._8_4_;
  uVar13 = (sampler->
           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  uVar8 = (ushort)(uVar13 >> 0x30);
  uVar11 = (uint)uVar8;
  local_2e0 = integrator;
  if (uVar13 >> 0x30 < 5) {
    if (uVar13 < 0x3000000000000) {
      if (uVar11 == 2) {
        u1 = (Tuple2<pbrt::Point2,_float>)
             StratifiedSampler::Get2D((StratifiedSampler *)(uVar13 & 0xffffffffffff));
      }
      else {
        u1 = (Tuple2<pbrt::Point2,_float>)
             RandomSampler::Get2D((RandomSampler *)(uVar13 & 0xffffffffffff));
      }
    }
    else {
      pHVar16 = (HaltonSampler *)(uVar13 & 0xffffffffffff);
      if ((uVar11 & 6) == 2) {
        iVar12 = 2;
        if (pHVar16->dimension < 999) {
          iVar12 = pHVar16->dimension;
        }
        pHVar16->dimension = iVar12 + 2;
        local_328._0_4_ = HaltonSampler::SampleDimension(pHVar16,iVar12);
        local_328._4_4_ = extraout_XMM0_Db;
        local_328._8_4_ = extraout_XMM0_Dc;
        local_328._12_4_ = extraout_XMM0_Dd;
        auVar24._0_4_ = HaltonSampler::SampleDimension(pHVar16,iVar12 + 1);
        auVar24._4_60_ = extraout_var;
        auVar21 = auVar24._0_16_;
LAB_003f4db5:
        auVar21 = vinsertps_avx(local_328,auVar21,0x10);
        u1 = auVar21._0_8_;
      }
      else {
        u1 = (Tuple2<pbrt::Point2,_float>)PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar16);
      }
    }
  }
  else {
    uVar15 = uVar8 - 4;
    if (uVar15 < 3) {
      if (uVar15 == 2) {
        u1 = (Tuple2<pbrt::Point2,_float>)
             ZSobolSampler::Get2D((ZSobolSampler *)(uVar13 & 0xffffffffffff));
      }
      else {
        u1 = (Tuple2<pbrt::Point2,_float>)
             SobolSampler::Get2D((SobolSampler *)(uVar13 & 0xffffffffffff));
      }
    }
    else {
      pDVar17 = (DebugMLTSampler *)(uVar13 & 0xffffffffffff);
      if (uVar11 - 6 < 2) {
        u1 = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar17);
      }
      else {
        if (uVar11 - 6 != 2) {
          local_328._0_4_ = DebugMLTSampler::Get1D(pDVar17);
          local_328._4_4_ = extraout_XMM0_Db_00;
          local_328._8_4_ = extraout_XMM0_Dc_00;
          local_328._12_4_ = extraout_XMM0_Dd_00;
          auVar25._0_4_ = DebugMLTSampler::Get1D(pDVar17);
          auVar25._4_60_ = extraout_var_00;
          auVar21 = auVar25._0_16_;
          goto LAB_003f4db5;
        }
        u1 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar17);
      }
    }
  }
  uVar13 = (sampler->
           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  uVar8 = (ushort)(uVar13 >> 0x30);
  uVar11 = (uint)uVar8;
  if (uVar13 < 0x5000000000000) {
    if (uVar13 < 0x3000000000000) {
      if (uVar11 == 2) {
        u2 = (Tuple2<pbrt::Point2,_float>)
             StratifiedSampler::Get2D((StratifiedSampler *)(uVar13 & 0xffffffffffff));
      }
      else {
        u2 = (Tuple2<pbrt::Point2,_float>)
             RandomSampler::Get2D((RandomSampler *)(uVar13 & 0xffffffffffff));
      }
      goto LAB_003f4ea8;
    }
    pHVar16 = (HaltonSampler *)(uVar13 & 0xffffffffffff);
    if ((uVar11 & 6) != 2) {
      u2 = (Tuple2<pbrt::Point2,_float>)PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar16);
      goto LAB_003f4ea8;
    }
    iVar12 = 2;
    if (pHVar16->dimension < 999) {
      iVar12 = pHVar16->dimension;
    }
    pHVar16->dimension = iVar12 + 2;
    local_2d8 = HaltonSampler::SampleDimension(pHVar16,iVar12);
    uStack_2d4 = extraout_XMM0_Db_01;
    uStack_2d0 = extraout_XMM0_Dc_01;
    uStack_2cc = extraout_XMM0_Dd_01;
    auVar26._0_4_ = HaltonSampler::SampleDimension(pHVar16,iVar12 + 1);
    auVar26._4_60_ = extraout_var_01;
    auVar21 = auVar26._0_16_;
  }
  else {
    uVar15 = uVar8 - 4;
    if (uVar15 < 3) {
      if (uVar15 == 2) {
        u2 = (Tuple2<pbrt::Point2,_float>)
             ZSobolSampler::Get2D((ZSobolSampler *)(uVar13 & 0xffffffffffff));
      }
      else {
        u2 = (Tuple2<pbrt::Point2,_float>)
             SobolSampler::Get2D((SobolSampler *)(uVar13 & 0xffffffffffff));
      }
      goto LAB_003f4ea8;
    }
    pDVar17 = (DebugMLTSampler *)(uVar13 & 0xffffffffffff);
    if (uVar11 - 6 < 2) {
      u2 = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar17);
      goto LAB_003f4ea8;
    }
    if (uVar11 - 6 == 2) {
      u2 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar17);
      goto LAB_003f4ea8;
    }
    local_2d8 = DebugMLTSampler::Get1D(pDVar17);
    uStack_2d4 = extraout_XMM0_Db_02;
    uStack_2d0 = extraout_XMM0_Dc_02;
    uStack_2cc = extraout_XMM0_Dd_02;
    auVar27._0_4_ = DebugMLTSampler::Get1D(pDVar17);
    auVar27._4_60_ = extraout_var_02;
    auVar21 = auVar27._0_16_;
  }
  auVar5._4_4_ = uStack_2d4;
  auVar5._0_4_ = local_2d8;
  auVar5._8_4_ = uStack_2d0;
  auVar5._12_4_ = uStack_2cc;
  auVar21 = vinsertps_avx(auVar5,auVar21,0x10);
  u2 = auVar21._0_8_;
LAB_003f4ea8:
  LightHandle::SampleLe(&les,&local_2f0.light,(Point2f)u1,(Point2f)u2,lambda,local_2e4);
  uVar11 = local_280;
  iVar12 = 0;
  if (((les.set == true) &&
      (((float)les.optionalValue._144_4_ != 0.0 || (NAN((float)les.optionalValue._144_4_))))) &&
     (((float)les.optionalValue._148_4_ != 0.0 || (NAN((float)les.optionalValue._148_4_))))) {
    if (((float)les.optionalValue._0_4_ == 0.0) && (!NAN((float)les.optionalValue._0_4_))) {
      uVar13 = 0xffffffffffffffff;
      do {
        if (uVar13 == 2) {
          return 0;
        }
        fVar28 = *(float *)((long)&les.optionalValue + uVar13 * 4 + 8);
        uVar13 = uVar13 + 1;
      } while ((fVar28 == 0.0) && (!NAN(fVar28)));
      if (2 < uVar13) {
        return 0;
      }
    }
    auStack_29c._4_4_ = les.optionalValue._32_4_;
    stack0xfffffffffffffd6c = les.optionalValue._36_8_;
    uVar19 = stack0xfffffffffffffd6c;
    local_2a8 = les.optionalValue._16_8_;
    auStack_29c._0_4_ = les.optionalValue._28_4_;
    local_288 = les.optionalValue._48_8_;
    local_280 = local_280 & 0xffffff00;
    fStack_27c = 0.0;
    _fStack_278 = SUB168(ZEXT816(0) << 0x40,4);
    uStack_270 = 0;
    fStack_268 = 0.0;
    uStack_264 = 0;
    uStack_25c = 0;
    uStack_254 = 0;
    if (les.optionalValue.__data[0x88] == '\x01') {
      local_178._12_4_ = les.optionalValue._96_4_;
      local_178._8_4_ = les.optionalValue._92_4_;
      local_178._20_4_ = les.optionalValue._104_4_;
      local_178._16_4_ = les.optionalValue._100_4_;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = les.optionalValue._56_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = les.optionalValue._64_8_;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = les.optionalValue._72_8_;
      local_178._0_8_ = les.optionalValue._84_8_;
      local_178._24_8_ = les.optionalValue._108_8_;
      uVar18 = les.optionalValue._116_4_;
    }
    else {
      auVar32._8_8_ = 0;
      auVar32._0_8_ = les.optionalValue._16_8_;
      FStack_290 = (Float)((ulong)les.optionalValue._36_8_ >> 0x20);
      local_178._0_32_ = ZEXT1632(ZEXT816(0) << 0x40);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = les.optionalValue._48_8_;
      les.optionalValue._120_16_ = vpslldq_avx(auVar33,8);
      uVar30 = (undefined4)les.optionalValue._16_8_;
      auVar34._4_4_ = uVar30;
      auVar34._0_4_ = uVar30;
      auVar34._8_4_ = uVar30;
      auVar34._12_4_ = uVar30;
      auVar21 = vmovshdup_avx(auVar32);
      auVar31._4_4_ = les.optionalValue._24_4_;
      auVar31._0_4_ = les.optionalValue._24_4_;
      auVar31._8_4_ = les.optionalValue._24_4_;
      auVar31._12_4_ = les.optionalValue._24_4_;
      les.optionalValue._80_4_ = FStack_290;
    }
    auVar9 = local_178._0_32_;
    auVar21 = vmovlhps_avx(auVar34,auVar21);
    local_a0 = 0;
    local_b0 = 0;
    uStack_ac = 0;
    uStack_a4 = 0;
    path->type = Light;
    *(ulong *)(path->beta).values.values = CONCAT44(les.optionalValue._4_4_,les.optionalValue._0_4_)
    ;
    *(ulong *)((path->beta).values.values + 2) =
         CONCAT44(les.optionalValue._12_4_,les.optionalValue._8_4_);
    *(undefined1 (*) [16])&path->field_2 = auVar21;
    IVar3 = (Interval)vmovlps_avx(auVar31);
    (path->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z = IVar3;
    (path->field_2).ei.super_Interaction.time = (Float)les.optionalValue._80_4_;
    (((Interaction *)&path->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.x =
         (float)local_178._0_4_;
    (((Interaction *)&path->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.y =
         (float)local_178._4_4_;
    *(undefined8 *)&(path->field_2).ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z =
         local_178._8_8_;
    (((Interaction *)&path->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.y =
         (float)local_178._16_4_;
    (((Interaction *)&path->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.z =
         (float)local_178._20_4_;
    (path->field_2).ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float> =
         (Tuple2<pbrt::Point2,_float>)local_178._24_8_;
    *(undefined4 *)&(path->field_2).ei.super_Interaction.field_0x3c = uVar18;
    *(undefined1 (*) [16])((long)&path->field_2 + 0x40) = les.optionalValue._120_16_;
    (path->field_2).ei.field_0 = local_2f0;
    *(undefined8 *)((long)&path->field_2 + 0x98) = local_110;
    *(undefined8 *)((long)&path->field_2 + 0xa0) = uStack_108;
    *(undefined8 *)((long)&path->field_2 + 0xa8) = uStack_100;
    *(undefined8 *)((long)&path->field_2 + 0xb0) = uStack_f8;
    *(undefined8 *)((long)&path->field_2 + 0xb8) = uStack_f0;
    (path->field_2).si.material.
    super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
    .bits = uStack_e8;
    (path->field_2).si.areaLight.
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    .bits = CONCAT44(uStack_dc,uStack_e0);
    *(ulong *)((long)&path->field_2 + 0xd0) = CONCAT44(uStack_d4,uStack_d8);
    *(uintptr_t *)((long)&path->field_2 + 0x58) = local_150.bits;
    *(undefined8 *)((long)&path->field_2 + 0x60) = uStack_148;
    *(undefined8 *)((long)&path->field_2 + 0x68) = uStack_140;
    *(undefined8 *)((long)&path->field_2 + 0x70) = uStack_138;
    *(undefined8 *)((long)&path->field_2 + 0x78) = uStack_130;
    *(undefined8 *)((long)&path->field_2 + 0x80) = uStack_128;
    *(undefined8 *)((long)&path->field_2 + 0x88) = uStack_120;
    *(undefined8 *)((long)&path->field_2 + 0x90) = uStack_118;
    *(ulong *)((long)&(path->field_2).si.areaLight.
                      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                      .bits + 4) = CONCAT44(uStack_d8,uStack_dc);
    *(ulong *)((long)&path->field_2 + 0xd4) = CONCAT44(uStack_d0,uStack_d4);
    *(undefined8 *)((long)&path->field_2 + 0xdc) = uStack_cc;
    *(undefined8 *)((long)&path->field_2 + 0xe4) = uStack_c4;
    *(undefined8 *)((long)&path->field_2 + 0xec) = uStack_bc;
    *(ulong *)((long)&path->field_2 + 0xf4) = (ulong)uStack_b4;
    *(undefined8 *)
     ((long)&(path->bsdf).bxdf.
             super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
             .bits + 4) = 0;
    (path->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
    (path->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
    (path->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
    (path->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    *(undefined8 *)&(path->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = 0;
    (path->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
    (path->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    (path->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    (path->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    (path->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
    path->delta = false;
    path->pdfFwd = (float)les.optionalValue._144_4_ * local_2e8;
    path->pdfRev = 0.0;
    if (les.optionalValue.__data[0x88] == '\0') {
      fVar28 = 1.0;
    }
    else {
      auStack_29c._8_4_ = (undefined4)les.optionalValue._36_8_;
      auVar21 = vfmadd132ss_fma(ZEXT416((uint)les.optionalValue._100_4_),
                                ZEXT416((uint)((float)les.optionalValue._104_4_ *
                                              (float)auStack_29c._8_4_)),
                                ZEXT416((uint)les.optionalValue._32_4_));
      auVar5 = vfmsub213ss_fma(ZEXT416((uint)auStack_29c._8_4_),
                               ZEXT416((uint)les.optionalValue._104_4_),
                               ZEXT416((uint)((float)les.optionalValue._104_4_ *
                                             (float)auStack_29c._8_4_)));
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ + auVar5._0_4_)),
                                ZEXT416((uint)les.optionalValue._96_4_),
                                ZEXT416((uint)les.optionalValue._28_4_));
      auVar6._8_4_ = 0x7fffffff;
      auVar6._0_8_ = 0x7fffffff7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      auVar21 = vandps_avx512vl(auVar21,auVar6);
      fVar28 = auVar21._0_4_;
    }
    auVar29._0_4_ = fVar28 * (float)les.optionalValue._0_4_;
    auVar29._4_4_ = fVar28 * (float)les.optionalValue._4_4_;
    auVar29._8_4_ = fVar28 * (float)les.optionalValue._8_4_;
    auVar29._12_4_ = fVar28 * (float)les.optionalValue._12_4_;
    fVar28 = (float)les.optionalValue._144_4_ * local_2e8 * (float)les.optionalValue._148_4_;
    auVar23._4_4_ = fVar28;
    auVar23._0_4_ = fVar28;
    auVar23._8_4_ = fVar28;
    auVar23._12_4_ = fVar28;
    auVar21 = vdivps_avx(auVar29,auVar23);
    local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = (float)les.optionalValue._16_4_;
    local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y = (float)les.optionalValue._20_4_;
    local_98.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)les.optionalValue._36_4_;
    local_98.super_Ray.time = (Float)les.optionalValue._40_4_;
    local_98._40_8_ = (ulong)uVar11 & 0xffffffffffffff00;
    local_98.super_Ray.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
             )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               )les.optionalValue._48_8_;
    local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y = fStack_278;
    local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z = fStack_274;
    local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
    local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    auVar5 = vshufpd_avx(auVar21,auVar21,1);
    local_180.bits =
         (sampler->
         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
         ).bits;
    local_188.bits =
         (local_2c0->
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         ).bits;
    beta.values.values._0_8_ = auVar21._0_8_;
    beta.values.values._8_8_ = auVar5._0_8_;
    unique0x10001691 = uVar19;
    fStack_26c = fStack_27c;
    uStack_260 = uStack_270;
    local_178._0_32_ = auVar9;
    local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = fStack_27c;
    local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = fStack_268;
    iVar12 = RandomWalk(local_2e0,lambda,&local_98,(SamplerHandle *)&local_180,
                        (CameraHandle *)&local_188,local_2b0,beta,(Float)les.optionalValue._148_4_,
                        (int)local_2b8 + -1,Importance,path + 1,regularize);
    if ((path->type == Light) &&
       ((puVar20 = (uint *)((ulong)(path->field_2).ei.field_0 & 0xffffffffffff),
        puVar20 == (uint *)0x0 || ((*puVar20 & 0xfffffffd) == 1)))) {
      if (0 < iVar12) {
        if (les.set == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
        }
        path[1].pdfFwd = (Float)les.optionalValue._144_4_;
        fVar28 = path[1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
        fVar1 = path[1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
        fVar2 = path[1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
        if ((((fVar28 != 0.0) || (fVar1 != 0.0)) || (fVar2 != 0.0)) || (NAN(fVar2))) {
          auVar21 = vfmadd132ss_fma(ZEXT416((uint)fVar1),
                                    ZEXT416((uint)(fVar2 * (float)auStack_29c._8_4_)),
                                    ZEXT416((uint)auStack_29c._4_4_));
          auVar5 = vfmsub213ss_fma(ZEXT416((uint)auStack_29c._8_4_),ZEXT416((uint)fVar2),
                                   ZEXT416((uint)(fVar2 * (float)auStack_29c._8_4_)));
          auVar21 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ + auVar5._0_4_)),
                                    ZEXT416((uint)fVar28),ZEXT416((uint)auStack_29c._0_4_));
          auVar7._8_4_ = 0x7fffffff;
          auVar7._0_8_ = 0x7fffffff7fffffff;
          auVar7._12_4_ = 0x7fffffff;
          auVar21 = vandps_avx512vl(auVar21,auVar7);
          path[1].pdfFwd = (float)les.optionalValue._144_4_ * auVar21._0_4_;
        }
      }
      local_190.
      super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
      .bits = *(TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                *)lightSampler.
                  super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                  .bits;
      FVar22 = InfiniteLightDensity(&local_2e0->infiniteLights,&local_190,(Vector3f *)auStack_29c);
      path->pdfFwd = FVar22;
    }
    iVar12 = iVar12 + 1;
  }
  return iVar12;
}

Assistant:

int GenerateLightSubpath(const Integrator &integrator, SampledWavelengths &lambda,
                         SamplerHandle sampler, CameraHandle camera,
                         ScratchBuffer &scratchBuffer, int maxDepth, Float time,
                         LightSamplerHandle lightSampler, Vertex *path, bool regularize) {
    // Generate light subpath and initialize _path_ vertices
    if (maxDepth == 0)
        return 0;
    // Sample initial ray for light subpath
    // Sample light for BDPT light subpath
    pstd::optional<SampledLight> sampledLight = lightSampler.Sample(sampler.Get1D());
    if (!sampledLight)
        return 0;
    LightHandle light = sampledLight->light;
    Float lightSamplePDF = sampledLight->pdf;

    Point2f ul0 = sampler.Get2D();
    Point2f ul1 = sampler.Get2D();
    pstd::optional<LightLeSample> les = light.SampleLe(ul0, ul1, lambda, time);
    if (!les || les->pdfPos == 0 || les->pdfDir == 0 || !les->L)
        return 0;
    RayDifferential ray(les->ray);

    // Generate first vertex of light subpath
    Float lightPDF = lightSamplePDF * les->pdfPos;
    path[0] = les->intr ? Vertex::CreateLight(light, *les->intr, les->L, lightPDF)
                        : Vertex::CreateLight(light, ray, les->L, lightPDF);

    // Follow light subpath random walk
    SampledSpectrum beta = les->L * les->AbsCosTheta(ray.d) / (lightPDF * les->pdfDir);
    PBRT_DBG("%s\n",
             StringPrintf(
                 "Starting light subpath. Ray: %s, Le %s, beta %s, pdfPos %f, pdfDir %f",
                 ray, les->L, beta, les->pdfPos, les->pdfDir)
                 .c_str());
    int nVertices = RandomWalk(integrator, lambda, ray, sampler, camera, scratchBuffer,
                               beta, les->pdfDir, maxDepth - 1, TransportMode::Importance,
                               path + 1, regularize);
    // Correct subpath sampling densities for infinite area lights
    if (path[0].IsInfiniteLight()) {
        // Set spatial density of _path[1]_ for infinite area light
        if (nVertices > 0) {
            path[1].pdfFwd = les->pdfPos;
            if (path[1].IsOnSurface())
                path[1].pdfFwd *= AbsDot(ray.d, path[1].ng());
        }

        // Set spatial density of _path[0]_ for infinite area light
        path[0].pdfFwd =
            InfiniteLightDensity(integrator.infiniteLights, lightSampler, ray.d);
    }

    return nVertices + 1;
}